

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O0

void __thiscall
glslang::TIntermediate::warn
          (TIntermediate *this,TInfoSink *infoSink,char *message,EShLanguage unitStage)

{
  TInfoSinkBase *pTVar1;
  char *pcVar2;
  EShLanguage unitStage_local;
  char *message_local;
  TInfoSink *infoSink_local;
  TIntermediate *this_local;
  
  TInfoSinkBase::prefix(&infoSink->info,EPrefixWarning);
  if (unitStage == EShLangCount) {
    pTVar1 = TInfoSinkBase::operator<<(&infoSink->info,"Linking ");
    pcVar2 = StageName(this->language);
    pTVar1 = TInfoSinkBase::operator<<(pTVar1,pcVar2);
    pTVar1 = TInfoSinkBase::operator<<(pTVar1," stage: ");
    pTVar1 = TInfoSinkBase::operator<<(pTVar1,message);
    TInfoSinkBase::operator<<(pTVar1,"\n");
  }
  else if (this->language == EShLangCount) {
    pTVar1 = TInfoSinkBase::operator<<(&infoSink->info,"Linking ");
    pcVar2 = StageName(unitStage);
    pTVar1 = TInfoSinkBase::operator<<(pTVar1,pcVar2);
    pTVar1 = TInfoSinkBase::operator<<(pTVar1," stage: ");
    pTVar1 = TInfoSinkBase::operator<<(pTVar1,message);
    TInfoSinkBase::operator<<(pTVar1,"\n");
  }
  else {
    pTVar1 = TInfoSinkBase::operator<<(&infoSink->info,"Linking ");
    pcVar2 = StageName(this->language);
    pTVar1 = TInfoSinkBase::operator<<(pTVar1,pcVar2);
    pTVar1 = TInfoSinkBase::operator<<(pTVar1," and ");
    pcVar2 = StageName(unitStage);
    pTVar1 = TInfoSinkBase::operator<<(pTVar1,pcVar2);
    pTVar1 = TInfoSinkBase::operator<<(pTVar1," stages: ");
    pTVar1 = TInfoSinkBase::operator<<(pTVar1,message);
    TInfoSinkBase::operator<<(pTVar1,"\n");
  }
  return;
}

Assistant:

void TIntermediate::warn(TInfoSink& infoSink, const char* message, EShLanguage unitStage)
{
    infoSink.info.prefix(EPrefixWarning);
    if (unitStage == EShLangCount)
        infoSink.info << "Linking " << StageName(language) << " stage: " << message << "\n";
    else if (language == EShLangCount)
        infoSink.info << "Linking " << StageName(unitStage) << " stage: " << message << "\n";
    else
        infoSink.info << "Linking " << StageName(language) << " and " << StageName(unitStage) << " stages: " << message << "\n";
}